

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall pybind11::error_already_set::~error_already_set(error_already_set *this)

{
  ~error_already_set(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

error_already_set::~error_already_set() {
    if (value) {
        gil_scoped_acquire gil;
        clear();
    }
}